

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O2

void duckdb::LeastGreatestFunction<double,duckdb::LessThan,duckdb::StandardLeastGreatest<false>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  Vector *pVVar1;
  bool bVar2;
  reference pvVar3;
  ulong uVar4;
  long lVar5;
  double *pdVar6;
  idx_t i;
  long lVar7;
  idx_t col_idx;
  ulong uVar8;
  double ivalue;
  Vector *local_8a0;
  double *local_898;
  ExpressionState *local_890;
  ulong local_888;
  UnifiedVectorFormat vdata;
  long local_878;
  long local_870;
  bool result_has_value [2048];
  
  lVar7 = *(long *)args;
  lVar5 = *(long *)(args + 8);
  if (lVar5 - lVar7 == 0x68) {
    vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
    duckdb::Vector::Reference(result);
    return;
  }
  local_8a0 = result;
  local_890 = state;
  for (uVar8 = 0; uVar8 < (ulong)((lVar5 - lVar7) / 0x68); uVar8 = uVar8 + 1) {
    vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,uVar8);
    lVar7 = *(long *)args;
    lVar5 = *(long *)(args + 8);
  }
  local_898 = *(double **)(local_8a0 + 0x20);
  uVar8 = 0;
  memset(result_has_value,0,0x800);
  do {
    pVVar1 = local_8a0;
    if ((ulong)((lVar5 - lVar7) / 0x68) <= uVar8) {
      StandardLeastGreatest<false>::FinalizeResult
                (*(idx_t *)(args + 0x18),result_has_value,local_8a0,local_890);
      duckdb::Vector::SetVectorType((VectorType)pVVar1);
      return;
    }
    pvVar3 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,uVar8);
    if (*pvVar3 == (value_type)0x2) {
      pvVar3 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,uVar8);
      if ((*(byte **)(pvVar3 + 0x28) == (byte *)0x0) || ((**(byte **)(pvVar3 + 0x28) & 1) != 0))
      goto LAB_0070fcde;
    }
    else {
LAB_0070fcde:
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
      pvVar3 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,uVar8);
      duckdb::Vector::ToUnifiedFormat((ulong)pvVar3,*(UnifiedVectorFormat **)(args + 0x18));
      local_888 = uVar8;
      if (local_870 == 0) {
        pdVar6 = local_898;
        for (uVar8 = 0; uVar8 < *(ulong *)(args + 0x18); uVar8 = uVar8 + 1) {
          uVar4 = uVar8;
          if (*_vdata != 0) {
            uVar4 = (ulong)*(uint *)(*_vdata + uVar8 * 4);
          }
          ivalue = *(double *)(local_878 + uVar4 * 8);
          if ((result_has_value[uVar8] != true) ||
             (bVar2 = duckdb::GreaterThan::Operation<double>(pdVar6,&ivalue), bVar2)) {
            result_has_value[uVar8] = true;
            *pdVar6 = ivalue;
          }
          pdVar6 = pdVar6 + 1;
        }
      }
      else {
        pdVar6 = local_898;
        for (uVar8 = 0; uVar8 < *(ulong *)(args + 0x18); uVar8 = uVar8 + 1) {
          uVar4 = uVar8;
          if (*_vdata != 0) {
            uVar4 = (ulong)*(uint *)(*_vdata + uVar8 * 4);
          }
          if (((local_870 == 0) ||
              ((*(ulong *)(local_870 + (uVar4 >> 6) * 8) >> (uVar4 & 0x3f) & 1) != 0)) &&
             ((ivalue = *(double *)(local_878 + uVar4 * 8), result_has_value[uVar8] != true ||
              (bVar2 = duckdb::GreaterThan::Operation<double>(pdVar6,&ivalue), bVar2)))) {
            result_has_value[uVar8] = true;
            *pdVar6 = ivalue;
          }
          pdVar6 = pdVar6 + 1;
        }
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&vdata);
      uVar8 = local_888;
    }
    uVar8 = uVar8 + 1;
    lVar7 = *(long *)args;
    lVar5 = *(long *)(args + 8);
  } while( true );
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}